

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeTextureCase::testDepthAttachment
          (AttachmentSizeTextureCase *this,GLenum internalFormat,GLenum attachment,GLint bitsD,
          GLint bitsS)

{
  GLuint local_24;
  GLint local_20;
  GLuint textureID;
  GLint bitsS_local;
  GLint bitsD_local;
  GLenum attachment_local;
  GLenum internalFormat_local;
  AttachmentSizeTextureCase *this_local;
  
  if (attachment != 0x821a) {
    local_24 = 0;
    local_20 = bitsS;
    textureID = bitsD;
    bitsS_local = attachment;
    bitsD_local = internalFormat;
    _attachment_local = this;
    glu::CallLogWrapper::glGenTextures
              (&(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,1,&local_24);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0xde1,local_24);
    glu::CallLogWrapper::glTexStorage2D
              (&(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0xde1,1,
               bitsD_local,0x80,0x80);
    ApiCase::expectError((ApiCase *)this,0);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
               bitsS_local,0xde1,local_24,0);
    ApiCase::expectError((ApiCase *)this,0);
    checkAttachmentComponentSizeAtLeast
              ((this->super_AttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,
               &(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
               bitsS_local,-1,-1,-1,-1,textureID,local_20);
    checkAttachmentComponentSizeExactly
              ((this->super_AttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,
               &(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
               bitsS_local,0,0,0,0,-1,-1);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
               bitsS_local,0xde1,0,0);
    glu::CallLogWrapper::glDeleteTextures
              (&(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper,1,&local_24);
  }
  return;
}

Assistant:

void testDepthAttachment (GLenum internalFormat, GLenum attachment, GLint bitsD, GLint bitsS)
	{
		// don't test stencil formats with textures
		if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
			return;

		GLuint textureID = 0;
		glGenTextures(1, &textureID);
		glBindTexture(GL_TEXTURE_2D, textureID);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalFormat, 128, 128);
		expectError(GL_NO_ERROR);

		glFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, textureID, 0);
		expectError(GL_NO_ERROR);

		checkAttachmentComponentSizeAtLeast	(m_testCtx, *this, GL_FRAMEBUFFER, attachment, -1, -1, -1, -1, bitsD, bitsS);
		checkAttachmentComponentSizeExactly	(m_testCtx, *this, GL_FRAMEBUFFER, attachment, 0, 0, 0, 0, -1, -1);

		glFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, 0, 0);
		glDeleteTextures(1, &textureID);
	}